

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureViewTestReferenceCounting::initTest(TextureViewTestReferenceCounting *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  initTextures(this);
  initProgram(this);
  initXFB(this);
  (**(code **)(lVar3 + 0x708))(1,&this->m_vao_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenVertexArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x276c);
  (**(code **)(lVar3 + 0xd8))(this->m_vao_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindVertexArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x276f);
  return;
}

Assistant:

void TextureViewTestReferenceCounting::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize all texture objects */
	initTextures();

	/* Initialize test program object */
	initProgram();

	/* Initialize XFB */
	initXFB();

	/* Generate and bind a vertex array object, since we'll be doing a number of
	 * draw calls later in the test */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");
}